

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Offset.h
# Opt level: O3

pair<dg::Offset,_dg::Offset> dg::dda::DefinitionsMap<dg::dda::RWNode>::getInterval(DefSite *ds)

{
  Offset OVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  Offset OVar5;
  pair<dg::Offset,_dg::Offset> pVar6;
  
  OVar1.offset = (ds->offset).offset;
  if (OVar1.offset != Offset::UNKNOWN) {
    uVar2 = (ds->len).offset;
    uVar4 = Offset::UNKNOWN;
    if (uVar2 != Offset::UNKNOWN) {
      uVar4 = uVar2 - 1;
      if (uVar2 == 0) {
        uVar4 = Offset::UNKNOWN;
      }
      if (Offset::UNKNOWN == 1) {
        uVar4 = Offset::UNKNOWN;
      }
    }
    OVar5.offset = uVar4 + OVar1.offset;
    if (Offset::UNKNOWN - uVar4 <= OVar1.offset) {
      OVar5.offset = Offset::UNKNOWN;
    }
    pVar6.second.offset = OVar5.offset;
    pVar6.first.offset = OVar1.offset;
    return pVar6;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = OVar1.offset;
  return (pair<dg::Offset,_dg::Offset>)(auVar3 << 0x40);
}

Assistant:

bool isUnknown() const { return offset == UNKNOWN; }